

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O2

bool __thiscall crunch::parse_scale_params(crunch *this,crn_mipmap_params *mipmap_params)

{
  crn_scale_mode cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  crn_uint32 cVar5;
  crn_uint32 cVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  dynamic_string *other;
  uint uVar11;
  crn_bool cVar12;
  command_line_params *this_00;
  char *pcVar13;
  float fVar14;
  float fVar15;
  dynamic_string mode_str;
  
  this_00 = &this->m_params;
  bVar2 = crnlib::command_line_params::has_key(this_00,"rescale");
  if (bVar2) {
    iVar3 = crnlib::command_line_params::get_value_as_int(this_00,"rescale",0,-1,1,0x1000,0);
    iVar4 = crnlib::command_line_params::get_value_as_int(this_00,"rescale",0,-1,1,0x1000,1);
    mipmap_params->m_scale_mode = cCRNSMAbsolute;
    mipmap_params->m_scale_x = (float)iVar3;
    mipmap_params->m_scale_y = (float)iVar4;
  }
  else {
    bVar2 = crnlib::command_line_params::has_key(this_00,"relrescale");
    if (bVar2) {
      fVar14 = crnlib::command_line_params::get_value_as_float
                         (this_00,"relrescale",0,1.0,1.0,256.0,0);
      fVar15 = crnlib::command_line_params::get_value_as_float
                         (this_00,"relrescale",0,1.0,1.0,256.0,1);
      mipmap_params->m_scale_mode = cCRNSMRelative;
      mipmap_params->m_scale_x = fVar14;
      mipmap_params->m_scale_y = fVar15;
    }
    else {
      bVar2 = crnlib::command_line_params::has_key(this_00,"rescalemode");
      if (bVar2) {
        other = crnlib::command_line_params::get_value_as_string_or_empty(this_00,"rescalemode",0,0)
        ;
        crnlib::dynamic_string::dynamic_string(&mode_str,other);
        bVar2 = crnlib::dynamic_string::operator==(&mode_str,"nearest");
        if (bVar2) {
          cVar1 = cCRNSMNearestPow2;
        }
        else {
          bVar2 = crnlib::dynamic_string::operator==(&mode_str,"hi");
          if (bVar2) {
            cVar1 = cCRNSMNextPow2;
          }
          else {
            bVar2 = crnlib::dynamic_string::operator==(&mode_str,"lo");
            if (!bVar2) {
              pcVar13 = "";
              if (mode_str.m_pStr != (char *)0x0) {
                pcVar13 = mode_str.m_pStr;
              }
              crnlib::console::error("Invalid rescale mode: \"%s\"",pcVar13);
              crnlib::dynamic_string::~dynamic_string(&mode_str);
              return false;
            }
            cVar1 = cCRNSMLowerPow2;
          }
        }
        mipmap_params->m_scale_mode = cVar1;
        crnlib::dynamic_string::~dynamic_string(&mode_str);
      }
    }
  }
  pcVar13 = "clamp";
  bVar2 = crnlib::command_line_params::has_key(this_00,"clamp");
  cVar12 = 0;
  if (!bVar2) {
    bVar2 = crnlib::command_line_params::has_key(this_00,"clampScale");
    if (!bVar2) goto LAB_0010c0f0;
    cVar12 = 1;
    pcVar13 = "clampscale";
  }
  cVar5 = crnlib::command_line_params::get_value_as_int(this_00,pcVar13,0,1,1,0x1000,0);
  cVar6 = crnlib::command_line_params::get_value_as_int(this_00,pcVar13,0,1,1,0x1000,1);
  mipmap_params->m_clamp_scale = cVar12;
  mipmap_params->m_clamp_width = cVar5;
  mipmap_params->m_clamp_height = cVar6;
LAB_0010c0f0:
  bVar2 = crnlib::command_line_params::has_key(this_00,"window");
  if (bVar2) {
    uVar7 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,0);
    uVar8 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,1);
    uVar9 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,2);
    uVar10 = crnlib::command_line_params::get_value_as_int(this_00,"window",0,0,0,0x1000,3);
    uVar11 = uVar9;
    if (uVar7 < uVar9) {
      uVar11 = uVar7;
    }
    if (uVar9 < uVar7) {
      uVar9 = uVar7;
    }
    mipmap_params->m_window_left = uVar11;
    uVar11 = uVar10;
    if (uVar8 < uVar10) {
      uVar11 = uVar8;
    }
    mipmap_params->m_window_top = uVar11;
    mipmap_params->m_window_right = uVar9;
    if (uVar10 < uVar8) {
      uVar10 = uVar8;
    }
    mipmap_params->m_window_bottom = uVar10;
  }
  return true;
}

Assistant:

bool parse_scale_params(crn_mipmap_params& mipmap_params)
    {
        if (m_params.has_key("rescale"))
        {
            int w = m_params.get_value_as_int("rescale", 0, -1, 1, cCRNMaxLevelResolution, 0);
            int h = m_params.get_value_as_int("rescale", 0, -1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_scale_mode = cCRNSMAbsolute;
            mipmap_params.m_scale_x = (float)w;
            mipmap_params.m_scale_y = (float)h;
        }
        else if (m_params.has_key("relrescale"))
        {
            float w = m_params.get_value_as_float("relrescale", 0, 1, 1, 256, 0);
            float h = m_params.get_value_as_float("relrescale", 0, 1, 1, 256, 1);

            mipmap_params.m_scale_mode = cCRNSMRelative;
            mipmap_params.m_scale_x = w;
            mipmap_params.m_scale_y = h;
        }
        else if (m_params.has_key("rescalemode"))
        {
            // nearest | hi | lo

            dynamic_string mode_str(m_params.get_value_as_string_or_empty("rescalemode"));
            if (mode_str == "nearest")
            {
                mipmap_params.m_scale_mode = cCRNSMNearestPow2;
            }
            else if (mode_str == "hi")
            {
                mipmap_params.m_scale_mode = cCRNSMNextPow2;
            }
            else if (mode_str == "lo")
            {
                mipmap_params.m_scale_mode = cCRNSMLowerPow2;
            }
            else
            {
                console::error("Invalid rescale mode: \"%s\"", mode_str.get_ptr());
                return false;
            }
        }

        if (m_params.has_key("clamp"))
        {
            uint32 w = m_params.get_value_as_int("clamp", 0, 1, 1, cCRNMaxLevelResolution, 0);
            uint32 h = m_params.get_value_as_int("clamp", 0, 1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_clamp_scale = false;
            mipmap_params.m_clamp_width = w;
            mipmap_params.m_clamp_height = h;
        }
        else if (m_params.has_key("clampScale"))
        {
            uint32 w = m_params.get_value_as_int("clampscale", 0, 1, 1, cCRNMaxLevelResolution, 0);
            uint32 h = m_params.get_value_as_int("clampscale", 0, 1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_clamp_scale = true;
            mipmap_params.m_clamp_width = w;
            mipmap_params.m_clamp_height = h;
        }

        if (m_params.has_key("window"))
        {
            uint32 xl = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 0);
            uint32 yl = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 1);
            uint32 xh = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 2);
            uint32 yh = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 3);

            mipmap_params.m_window_left = math::minimum(xl, xh);
            mipmap_params.m_window_top = math::minimum(yl, yh);
            mipmap_params.m_window_right = math::maximum(xl, xh);
            mipmap_params.m_window_bottom = math::maximum(yl, yh);
        }

        return true;
    }